

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O0

int lj_cf_table_clone(lua_State *L)

{
  GCtab *pGVar1;
  GCtab *dup;
  GCtab *src;
  lua_State *L_local;
  
  pGVar1 = lj_lib_checktab(L,1);
  pGVar1 = lj_tab_dup(L,pGVar1);
  L->base->u64 = (ulong)pGVar1 | 0xfffa000000000000;
  L->top = L->base + 1;
  return 1;
}

Assistant:

LJLIB_NOREG LJLIB_CF(table_clone) LJLIB_REC(.)
{
  GCtab *src = lj_lib_checktab(L, 1);
  GCtab *dup = lj_tab_dup(L, src);

  settabV(L, L->base, dup);
  L->top = L->base+1;

  return 1;
}